

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcRectangleProfileDef *in;
  
  in = (IfcRectangleProfileDef *)operator_new(0xa8);
  *(undefined ***)&in->field_0x90 = &PTR__Object_008f50b0;
  *(undefined8 *)&in->field_0x98 = 0;
  *(char **)&in->field_0xa0 = "IfcRectangleProfileDef";
  Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::IfcParameterizedProfileDef
            ((IfcParameterizedProfileDef *)in,&PTR_construction_vtable_24__00919668);
  *(undefined8 *)&(in->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRectangleProfileDef_009195d8;
  *(undefined ***)&in->field_0x90 = &PTR__IfcRectangleProfileDef_00919650;
  *(undefined ***)&(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 =
       &PTR__IfcRectangleProfileDef_00919600;
  *(undefined ***)&(in->super_IfcParameterizedProfileDef).field_0x70 =
       &PTR__IfcRectangleProfileDef_00919628;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRectangleProfileDef>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
         + (long)(in->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                 [-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }